

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTcpServer.cpp
# Opt level: O0

void __thiscall liblogger::LogTcpServer::~LogTcpServer(LogTcpServer *this)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  reference pvVar4;
  ILogger *in_RDI;
  int fd;
  void *ret;
  char value;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  void *local_18;
  undefined1 local_9 [9];
  
  in_RDI->_vptr_ILogger = (_func_int **)&PTR__LogTcpServer_001cc918;
  if (((ulong)in_RDI[0xc]._vptr_ILogger & 1) != 0) {
    local_9[0] = 0x51;
    sVar3 = write(*(int *)((long)&in_RDI[0xb]._vptr_ILogger + 4),local_9,1);
    if (sVar3 != 1) {
      abort();
    }
    local_18 = (void *)0x0;
    iVar2 = pthread_join((pthread_t)in_RDI[1]._vptr_ILogger,&local_18);
    if (iVar2 != 0) {
      abort();
    }
    *(undefined1 *)&in_RDI[0xc]._vptr_ILogger = 0;
  }
  while (bVar1 = std::__cxx11::list<int,_std::allocator<int>_>::empty
                           ((list<int,_std::allocator<int>_> *)(in_RDI + 7)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar4 = std::__cxx11::list<int,_std::allocator<int>_>::front
                       ((list<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    iVar2 = close(*pvVar4);
    if (iVar2 < 0) {
      abort();
    }
    std::__cxx11::list<int,_std::allocator<int>_>::pop_front
              ((list<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  if ((-1 < *(int *)((long)&in_RDI[10]._vptr_ILogger + 4)) &&
     (iVar2 = close(*(int *)((long)&in_RDI[10]._vptr_ILogger + 4)), iVar2 < 0)) {
    abort();
  }
  if ((-1 < *(int *)&in_RDI[0xb]._vptr_ILogger) &&
     (iVar2 = close(*(int *)&in_RDI[0xb]._vptr_ILogger), iVar2 < 0)) {
    abort();
  }
  if ((-1 < *(int *)((long)&in_RDI[0xb]._vptr_ILogger + 4)) &&
     (iVar2 = close(*(int *)((long)&in_RDI[0xb]._vptr_ILogger + 4)), iVar2 < 0)) {
    abort();
  }
  iVar2 = pthread_mutex_destroy((pthread_mutex_t *)(in_RDI + 2));
  if (iVar2 == 0) {
    std::__cxx11::list<int,_std::allocator<int>_>::~list
              ((list<int,_std::allocator<int>_> *)0x1acdbc);
    ILogger::~ILogger(in_RDI);
    return;
  }
  abort();
}

Assistant:

LogTcpServer::~LogTcpServer()
{
	if (m_running)
	{
		char value = 'Q';

		if (write(m_ctlfd[1], &value, sizeof(value)) != sizeof(value))
		{
			abort();
		}

		void *ret = NULL;
		if (pthread_join(m_thread, &ret) != 0)
		{
			abort();
		}
		m_running = false;
	}

	//No background thread. So no locking required from this point on

	while(!m_list.empty())
	{
		int fd = m_list.front();
		if (close(fd) < 0)
			abort();
		m_list.pop_front();
	}

	if (m_acceptfd >= 0)
	{
		if (close(m_acceptfd) < 0)
		{
			abort();
		}
	}

	if (m_ctlfd[0] >= 0)
	{
		if (close(m_ctlfd[0]) < 0)
		{
			abort();
		}
	}

	if (m_ctlfd[1] >= 0)
	{
		if (close(m_ctlfd[1]) < 0)
		{
			abort();
		}
	}

	if (pthread_mutex_destroy(&m_mutex) != 0)
		abort();

}